

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# meta_pipeline.cpp
# Opt level: O1

void __thiscall
duckdb::MetaPipeline::AddRecursiveDependencies
          (MetaPipeline *this,
          vector<duckdb::shared_ptr<duckdb::Pipeline,_true>,_true> *new_dependencies,
          MetaPipeline *last_child)

{
  element_type *peVar1;
  pointer psVar2;
  iterator __position;
  type pMVar3;
  DatabaseInstance *this_00;
  TaskScheduler *pTVar4;
  unsigned_long uVar5;
  type pPVar6;
  idx_t iVar7;
  vector<std::reference_wrapper<duckdb::Pipeline>,std::allocator<std::reference_wrapper<duckdb::Pipeline>>>
  *this_01;
  shared_ptr<duckdb::Pipeline,_true> *pipeline;
  shared_ptr<duckdb::Pipeline,_true> *this_02;
  shared_ptr<duckdb::Pipeline,_true> *new_dependency;
  pointer this_03;
  shared_ptr<duckdb::MetaPipeline,_true> *psVar8;
  pointer this_04;
  vector<duckdb::shared_ptr<duckdb::MetaPipeline,_true>,_true> child_meta_pipelines;
  vector<duckdb::shared_ptr<duckdb::Pipeline,_true>,_true> *__range3;
  key_type local_78;
  MetaPipeline *local_70;
  vector<duckdb::shared_ptr<duckdb::MetaPipeline,_true>,_std::allocator<duckdb::shared_ptr<duckdb::MetaPipeline,_true>_>_>
  local_68;
  shared_ptr<duckdb::MetaPipeline,_true> *local_48;
  vector<duckdb::shared_ptr<duckdb::Pipeline,_true>,_true> *local_40;
  shared_ptr<duckdb::Pipeline,_true> *local_38;
  
  if (this->recursive_cte == false) {
    local_68.
    super__Vector_base<duckdb::shared_ptr<duckdb::MetaPipeline,_true>,_std::allocator<duckdb::shared_ptr<duckdb::MetaPipeline,_true>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (shared_ptr<duckdb::MetaPipeline,_true> *)0x0;
    local_68.
    super__Vector_base<duckdb::shared_ptr<duckdb::MetaPipeline,_true>,_std::allocator<duckdb::shared_ptr<duckdb::MetaPipeline,_true>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (shared_ptr<duckdb::MetaPipeline,_true> *)0x0;
    local_68.
    super__Vector_base<duckdb::shared_ptr<duckdb::MetaPipeline,_true>,_std::allocator<duckdb::shared_ptr<duckdb::MetaPipeline,_true>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_40 = new_dependencies;
    GetMetaPipelines(this,(vector<duckdb::shared_ptr<duckdb::MetaPipeline,_true>,_true> *)&local_68,
                     true,false);
    this_03 = local_68.
              super__Vector_base<duckdb::shared_ptr<duckdb::MetaPipeline,_true>,_std::allocator<duckdb::shared_ptr<duckdb::MetaPipeline,_true>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    while( true ) {
      pMVar3 = shared_ptr<duckdb::MetaPipeline,_true>::operator*(this_03);
      if (pMVar3 == last_child) break;
      this_03 = this_03 + 1;
    }
    local_70 = this;
    this_00 = DatabaseInstance::GetDatabase(this->executor->context);
    pTVar4 = DatabaseInstance::GetScheduler(this_00);
    uVar5 = NumericCastImpl<unsigned_long,_int,_false>::Convert
                      ((pTVar4->current_thread_count).super___atomic_base<int>._M_i);
    psVar8 = this_03 + 1;
    if (psVar8 != local_68.
                  super__Vector_base<duckdb::shared_ptr<duckdb::MetaPipeline,_true>,_std::allocator<duckdb::shared_ptr<duckdb::MetaPipeline,_true>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish) {
      local_70 = (MetaPipeline *)&local_70->pipeline_dependencies;
      do {
        peVar1 = (psVar8->internal).
                 super___shared_ptr<duckdb::MetaPipeline,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        this_02 = (peVar1->pipelines).
                  super_vector<duckdb::shared_ptr<duckdb::Pipeline,_true>,_std::allocator<duckdb::shared_ptr<duckdb::Pipeline,_true>_>_>
                  .
                  super__Vector_base<duckdb::shared_ptr<duckdb::Pipeline,_true>,_std::allocator<duckdb::shared_ptr<duckdb::Pipeline,_true>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        local_38 = *(pointer *)
                    ((long)&(peVar1->pipelines).
                            super_vector<duckdb::shared_ptr<duckdb::Pipeline,_true>,_std::allocator<duckdb::shared_ptr<duckdb::Pipeline,_true>_>_>
                            .
                            super__Vector_base<duckdb::shared_ptr<duckdb::Pipeline,_true>,_std::allocator<duckdb::shared_ptr<duckdb::Pipeline,_true>_>_>
                            ._M_impl + 8);
        local_48 = psVar8;
        if (this_02 != local_38) {
          do {
            pPVar6 = shared_ptr<duckdb::Pipeline,_true>::operator*(this_02);
            local_78._M_data = (Pipeline *)(pPVar6->source).ptr;
            optional_ptr<duckdb::PhysicalOperator,_true>::CheckValid
                      ((optional_ptr<duckdb::PhysicalOperator,_true> *)&local_78);
            iVar7 = PhysicalOperator::EstimatedThreadCount((PhysicalOperator *)local_78._M_data);
            if (uVar5 < iVar7) {
              local_78._M_data = shared_ptr<duckdb::Pipeline,_true>::operator*(this_02);
              this_01 = (vector<std::reference_wrapper<duckdb::Pipeline>,std::allocator<std::reference_wrapper<duckdb::Pipeline>>>
                         *)::std::__detail::
                           _Map_base<std::reference_wrapper<duckdb::Pipeline>,_std::pair<const_std::reference_wrapper<duckdb::Pipeline>,_duckdb::vector<std::reference_wrapper<duckdb::Pipeline>,_true>_>,_std::allocator<std::pair<const_std::reference_wrapper<duckdb::Pipeline>,_duckdb::vector<std::reference_wrapper<duckdb::Pipeline>,_true>_>_>,_std::__detail::_Select1st,_duckdb::ReferenceEquality<duckdb::Pipeline>,_duckdb::ReferenceHashFunction<duckdb::Pipeline>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                           ::operator[]((_Map_base<std::reference_wrapper<duckdb::Pipeline>,_std::pair<const_std::reference_wrapper<duckdb::Pipeline>,_duckdb::vector<std::reference_wrapper<duckdb::Pipeline>,_true>_>,_std::allocator<std::pair<const_std::reference_wrapper<duckdb::Pipeline>,_duckdb::vector<std::reference_wrapper<duckdb::Pipeline>,_true>_>_>,_std::__detail::_Select1st,_duckdb::ReferenceEquality<duckdb::Pipeline>,_duckdb::ReferenceHashFunction<duckdb::Pipeline>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                         *)local_70,&local_78);
              psVar2 = (local_40->
                       super_vector<duckdb::shared_ptr<duckdb::Pipeline,_true>,_std::allocator<duckdb::shared_ptr<duckdb::Pipeline,_true>_>_>
                       ).
                       super__Vector_base<duckdb::shared_ptr<duckdb::Pipeline,_true>,_std::allocator<duckdb::shared_ptr<duckdb::Pipeline,_true>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish;
              for (this_04 = (local_40->
                             super_vector<duckdb::shared_ptr<duckdb::Pipeline,_true>,_std::allocator<duckdb::shared_ptr<duckdb::Pipeline,_true>_>_>
                             ).
                             super__Vector_base<duckdb::shared_ptr<duckdb::Pipeline,_true>,_std::allocator<duckdb::shared_ptr<duckdb::Pipeline,_true>_>_>
                             ._M_impl.super__Vector_impl_data._M_start; this_04 != psVar2;
                  this_04 = this_04 + 1) {
                pPVar6 = shared_ptr<duckdb::Pipeline,_true>::operator*(this_04);
                local_78._M_data = (Pipeline *)(pPVar6->source).ptr;
                optional_ptr<duckdb::PhysicalOperator,_true>::CheckValid
                          ((optional_ptr<duckdb::PhysicalOperator,_true> *)&local_78);
                iVar7 = PhysicalOperator::EstimatedThreadCount((PhysicalOperator *)local_78._M_data)
                ;
                if (uVar5 < iVar7) {
                  local_78._M_data = shared_ptr<duckdb::Pipeline,_true>::operator*(this_04);
                  __position._M_current = *(reference_wrapper<duckdb::Pipeline> **)(this_01 + 8);
                  if (__position._M_current ==
                      *(reference_wrapper<duckdb::Pipeline> **)(this_01 + 0x10)) {
                    ::std::
                    vector<std::reference_wrapper<duckdb::Pipeline>,std::allocator<std::reference_wrapper<duckdb::Pipeline>>>
                    ::_M_realloc_insert<std::reference_wrapper<duckdb::Pipeline>>
                              (this_01,__position,&local_78);
                  }
                  else {
                    (__position._M_current)->_M_data = local_78._M_data;
                    *(long *)(this_01 + 8) = *(long *)(this_01 + 8) + 8;
                  }
                }
              }
            }
            this_02 = this_02 + 1;
          } while (this_02 != local_38);
        }
        psVar8 = local_48 + 1;
      } while (psVar8 != local_68.
                         super__Vector_base<duckdb::shared_ptr<duckdb::MetaPipeline,_true>,_std::allocator<duckdb::shared_ptr<duckdb::MetaPipeline,_true>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish);
    }
    ::std::
    vector<duckdb::shared_ptr<duckdb::MetaPipeline,_true>,_std::allocator<duckdb::shared_ptr<duckdb::MetaPipeline,_true>_>_>
    ::~vector(&local_68);
  }
  return;
}

Assistant:

void MetaPipeline::AddRecursiveDependencies(const vector<shared_ptr<Pipeline>> &new_dependencies,
                                            const MetaPipeline &last_child) {
	if (recursive_cte) {
		return; // let's not burn our fingers on this for now
	}

	vector<shared_ptr<MetaPipeline>> child_meta_pipelines;
	this->GetMetaPipelines(child_meta_pipelines, true, false);

	// find the meta pipeline that has the same sink as 'pipeline'
	auto it = child_meta_pipelines.begin();
	for (; !RefersToSameObject(last_child, **it); it++) {
	}
	D_ASSERT(it != child_meta_pipelines.end());

	// skip over it
	it++;

	// we try to limit the performance impact of these dependencies on smaller workloads,
	// by only adding the dependencies if the source operator can likely keep all threads busy
	const auto thread_count = NumericCast<idx_t>(TaskScheduler::GetScheduler(executor.context).NumberOfThreads());
	for (; it != child_meta_pipelines.end(); it++) {
		for (auto &pipeline : it->get()->pipelines) {
			if (!PipelineExceedsThreadCount(*pipeline, thread_count)) {
				continue;
			}
			auto &pipeline_deps = pipeline_dependencies[*pipeline];
			for (auto &new_dependency : new_dependencies) {
				if (!PipelineExceedsThreadCount(*new_dependency, thread_count)) {
					continue;
				}
				pipeline_deps.push_back(*new_dependency);
			}
		}
	}
}